

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::internal::DecodeRoute64
                  (Error *__return_storage_ptr__,Route64 *aRoute64,ByteArray *aBuf)

{
  pointer *ppRVar1;
  byte bVar2;
  pointer puVar3;
  iterator __position;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  format_args args;
  format_args args_00;
  RouteDataEntry entry;
  undefined8 local_b8;
  pointer puStack_b0;
  pointer local_a8;
  undefined8 local_a0;
  format_string_checker<char> *local_98;
  parse_func local_90 [1];
  string *local_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ErrorCode local_58 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  local_88 = (string *)&__return_storage_ptr__->mMessage;
  local_60 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_60;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (uVar7 < 9) {
    local_b8 = (pointer)((ulong)local_b8 & 0xffffffff00000000);
    puStack_b0 = "incorrect size of Route64";
    local_a8 = (pointer)0x19;
    local_a0._0_4_ = 0;
    local_a0._4_4_ = 0;
    local_90[0] = (parse_func)0x0;
    pcVar6 = "incorrect size of Route64";
    local_98 = (format_string_checker<char> *)&local_b8;
    do {
      pcVar4 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)&local_b8);
      }
      pcVar6 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_b8;
    fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"incorrect size of Route64",(string_view)ZEXT816(0x19),args);
    local_58[0] = kBadFormat;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    __return_storage_ptr__->mCode = local_58[0];
    std::__cxx11::string::operator=(local_88,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pvVar9 = (void *)0x0;
  }
  else {
    aRoute64->mIdSequence = *puVar3;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + 1),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + 9),(allocator_type *)local_58);
    puVar3 = (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_b8;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_b0;
    (aRoute64->mMask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_a8;
    local_b8 = (pointer)0x0;
    puStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8);
    }
    ExtractRouterIds((ByteArray *)&local_b8,&aRoute64->mMask);
    pvVar9 = local_b8;
    if (uVar7 - 9 == (long)puStack_b0 - (long)local_b8) {
      if (uVar7 != 9) {
        uVar5 = 10;
        if (10 < uVar7) {
          uVar5 = uVar7;
        }
        lVar8 = 0;
        do {
          uVar7 = (ulong)local_b8 >> 0x18;
          bVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8 + 9];
          local_b8._0_2_ = CONCAT11(bVar2 >> 6,*(undefined1 *)((long)pvVar9 + lVar8));
          local_b8 = (pointer)(CONCAT53((int5)uVar7,CONCAT12(bVar2 >> 4,(undefined2)local_b8)) &
                              0xffffffff0003ffff);
          local_b8 = (pointer)(CONCAT44(local_b8._4_4_,CONCAT13(bVar2,(undefined3)local_b8)) &
                              0xffffffff0fffffff);
          __position._M_current =
               (aRoute64->mRouteData).
               super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (aRoute64->mRouteData).
              super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
            ::_M_realloc_insert<ot::commissioner::RouteDataEntry&>
                      ((vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
                        *)&aRoute64->mRouteData,__position,(RouteDataEntry *)&local_b8);
          }
          else {
            *__position._M_current = local_b8._0_4_;
            ppRVar1 = &(aRoute64->mRouteData).
                       super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppRVar1 = *ppRVar1 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (uVar5 - 9 != lVar8);
      }
    }
    else {
      local_b8 = (pointer)((ulong)local_b8 & 0xffffffff00000000);
      puStack_b0 = "incorrect size of RouteData";
      local_a8 = (pointer)0x1b;
      local_a0._0_4_ = 0;
      local_a0._4_4_ = 0;
      local_90[0] = (parse_func)0x0;
      pcVar6 = "incorrect size of RouteData";
      local_98 = (format_string_checker<char> *)&local_b8;
      do {
        pcVar4 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar4 = fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",(format_string_checker<char> *)&local_b8);
        }
        pcVar6 = pcVar4;
      } while (pcVar4 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_b8;
      fmt::v10::vformat_abi_cxx11_
                (&local_80,(v10 *)"incorrect size of RouteData",(string_view)ZEXT816(0x1b),args_00);
      local_58[0] = kBadFormat;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      __return_storage_ptr__->mCode = local_58[0];
      std::__cxx11::string::operator=(local_88,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeRoute64(Route64 &aRoute64, const ByteArray &aBuf)
{
    Error     error;
    size_t    length = aBuf.size();
    size_t    offset = 0;
    ByteArray routerIdList;

    VerifyOrExit(length >= kRouterIdMaskBytes + 1, error = ERROR_BAD_FORMAT("incorrect size of Route64"));
    aRoute64.mIdSequence = aBuf[offset++];
    aRoute64.mMask       = {aBuf.begin() + offset, aBuf.begin() + offset + kRouterIdMaskBytes};
    offset += kRouterIdMaskBytes;

    routerIdList = ExtractRouterIds(aRoute64.mMask);
    VerifyOrExit((length - offset) == routerIdList.size(), error = ERROR_BAD_FORMAT("incorrect size of RouteData"));
    while (offset < length)
    {
        RouteDataEntry entry;
        entry.mRouterId = routerIdList[offset - kRouterIdMaskBytes - 1];
        DecodeRouteDataEntry(entry, aBuf[offset]);
        aRoute64.mRouteData.emplace_back(entry);
        offset++;
    }

exit:
    return error;
}